

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall Lexer::token(Lexer *this,string *token,Type *type)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  while (bVar1 = unicodeWhitespace((int)(this->_text)._M_dataplus._M_p[this->_cursor]), bVar1) {
    utf8_next_char(&this->_text,&this->_cursor);
  }
  if (this->_cursor < this->_eos) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\'\"",&local_41);
    bVar1 = isString(this,token,type,&local_40);
    if ((((((!bVar1) && (bVar1 = isUUID(this,token,type,true), !bVar1)) &&
          (bVar1 = isDate(this,token,type), !bVar1)) &&
         ((bVar1 = isDuration(this,token,type), !bVar1 && (bVar1 = isURL(this,token,type), !bVar1)))
         ) && ((bVar1 = isHexNumber(this,token,type), !bVar1 &&
               ((bVar1 = isNumber(this,token,type), !bVar1 &&
                (bVar1 = isPath(this,token,type), !bVar1)))))) &&
       ((bVar1 = isPattern(this,token,type), !bVar1 && (bVar1 = isOperator(this,token,type), !bVar1)
        ))) {
      bVar1 = isWord(this,token,type);
      std::__cxx11::string::~string((string *)&local_40);
      return bVar1;
    }
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Lexer::token (std::string& token, Lexer::Type& type)
{
  // Eat white space.
  while (unicodeWhitespace (_text[_cursor]))
    utf8_next_char (_text, _cursor);

  // Terminate at EOS.
  if (isEOS ())
    return false;

  if (isString    (token, type, "'\"") ||
      isUUID      (token, type, true)  ||
      isDate      (token, type)        ||
      isDuration  (token, type)        ||
      isURL       (token, type)        ||
      isHexNumber (token, type)        ||
      isNumber    (token, type)        ||
      isPath      (token, type)        ||
      isPattern   (token, type)        ||
      isOperator  (token, type)        ||
      isWord      (token, type))
    return true;

  return false;
}